

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O0

void base64_stream_encode_ssse3
               (base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  uint8_t *puVar1;
  int local_5c;
  base64_state st;
  size_t slen;
  size_t olen;
  uint8_t *o;
  uint8_t *s;
  size_t *outlen_local;
  char *out_local;
  size_t srclen_local;
  char *src_local;
  base64_state *state_local;
  
  slen = 0;
  local_5c = state->bytes;
  st.bytes._0_1_ = state->carry;
  st._8_8_ = srclen;
  olen = (size_t)out;
  o = (uint8_t *)src;
  s = (uint8_t *)outlen;
  outlen_local = (size_t *)out;
  out_local = (char *)srclen;
  srclen_local = (size_t)src;
  src_local = (char *)state;
  if (local_5c == 0) goto LAB_00103d0d;
  st._8_8_ = srclen;
  olen = (size_t)out;
  o = (uint8_t *)src;
  if (local_5c == 1) goto LAB_00103d94;
  st._8_8_ = srclen;
  olen = (size_t)out;
  o = (uint8_t *)src;
  if (local_5c == 2) {
    while (st._8_8_ != 0) {
      puVar1 = (uint8_t *)(olen + 1);
      *(uint8_t *)olen =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((uint)(byte)st.bytes | (int)(uint)*o >> 6)];
      olen = olen + 2;
      *puVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(int)(*o & 0x3f)]
      ;
      local_5c = 0;
      slen = slen + 2;
      st._8_8_ = st._8_8_ + -1;
      o = o + 1;
LAB_00103d0d:
      enc_loop_ssse3(&o,(size_t *)&st.flags,(uint8_t **)&olen,&slen);
      if (st._8_8_ == 0) break;
      *(uint8_t *)olen =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(int)(uint)*o >> 2];
      st.bytes._0_1_ = (*o & 3) << 4;
      local_5c = local_5c + 1;
      slen = slen + 1;
      st._8_8_ = st._8_8_ + -1;
      olen = olen + 1;
      o = o + 1;
LAB_00103d94:
      if (st._8_8_ == 0) break;
      *(uint8_t *)olen =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((uint)(byte)st.bytes | (int)(uint)*o >> 4)];
      st.bytes._0_1_ = (*o & 0xf) << 2;
      local_5c = local_5c + 1;
      slen = slen + 1;
      st._8_8_ = st._8_8_ + -1;
      olen = olen + 1;
      o = o + 1;
    }
  }
  *(int *)(src_local + 4) = local_5c;
  src_local[0xc] = (byte)st.bytes;
  *(size_t *)s = slen;
  return;
}

Assistant:

BASE64_ENC_FUNCTION(ssse3)
{
#if HAVE_SSSE3
	#include "../generic/enc_head.c"
	enc_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}